

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O0

bool __thiscall
tfeedback_decl::store
          (tfeedback_decl *this,gl_context *ctx,gl_shader_program *prog,
          gl_transform_feedback_info *info,uint buffer,uint buffer_index,uint max_outputs,
          uint **used_components,bool *explicit_stride,bool has_xfb_qualifiers,void *mem_ctx)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  bool bVar5;
  uint32_t local_9c;
  uint local_98;
  uint local_90;
  uint local_7c;
  uint output_size;
  uint end_range;
  uint start_range;
  uint word;
  uint *used;
  uint end_word;
  uint start_word;
  uint last_component;
  uint first_component;
  uint max_components;
  uint num_components;
  uint location_frac;
  uint location;
  uint size;
  uint xfb_offset;
  bool has_xfb_qualifiers_local;
  uint buffer_index_local;
  uint buffer_local;
  gl_transform_feedback_info *info_local;
  gl_shader_program *prog_local;
  gl_context *ctx_local;
  tfeedback_decl *this_local;
  
  location_frac = this->size;
  if (this->skip_components == 0) {
    if ((this->next_buffer_separator & 1U) == 0) {
      if (has_xfb_qualifiers) {
        location = this->offset >> 2;
      }
      else {
        location = info->Buffers[buffer].Stride;
      }
      info->Varyings[info->NumVarying].Offset = location << 2;
      num_components = this->location;
      max_components = this->location_frac;
      first_component = tfeedback_decl::num_components(this);
      if ((((prog->TransformFeedback).BufferMode == 0x8c8c) || (has_xfb_qualifiers)) &&
         ((ctx->Const).MaxTransformFeedbackInterleavedComponents < location + first_component)) {
        linker_error(prog,
                     "The MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS limit has been exceeded.");
        return false;
      }
      uVar1 = (ctx->Const).MaxTransformFeedbackInterleavedComponents;
      uVar2 = (location + first_component) - 1;
      if (uVar1 <= uVar2) {
        __assert_fail("last_component < max_components",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                      ,0x4dc,
                      "bool tfeedback_decl::store(struct gl_context *, struct gl_shader_program *, struct gl_transform_feedback_info *, unsigned int, unsigned int, const unsigned int, unsigned int **, bool *, bool, const void *) const"
                     );
      }
      if (used_components[buffer] == (uint *)0x0) {
        puVar3 = (uint *)rzalloc_array_size(mem_ctx,4,(uint)((ulong)uVar1 + 0x1f >> 5));
        used_components[buffer] = puVar3;
      }
      puVar3 = used_components[buffer];
      for (end_range = location >> 5; end_range <= uVar2 >> 5; end_range = end_range + 1) {
        output_size._0_1_ = 0;
        local_7c = 0x1f;
        if (end_range == location >> 5) {
          output_size._0_1_ = (byte)location & 0x1f;
        }
        if (end_range == uVar2 >> 5) {
          local_7c = uVar2 & 0x1f;
        }
        if ((local_7c + 1 & 0x1f) == 0) {
          local_90 = 0xffffffff;
        }
        else {
          local_90 = (1 << ((char)local_7c + 1U & 0x1f)) - 1;
        }
        if ((puVar3[end_range] & local_90 & ((1 << (byte)output_size) - 1U ^ 0xffffffff)) != 0) {
          linker_error(prog,"variable \'%s\', xfb_offset (%d) is causing aliasing.",this->orig_name,
                       (ulong)(location << 2));
          return false;
        }
        if ((local_7c + 1 & 0x1f) == 0) {
          local_98 = 0xffffffff;
        }
        else {
          local_98 = (1 << ((char)local_7c + 1U & 0x1f)) - 1;
        }
        puVar3[end_range] =
             local_98 & ((1 << (byte)output_size) - 1U ^ 0xffffffff) | puVar3[end_range];
      }
      for (; first_component != 0; first_component = first_component - local_9c) {
        if (first_component < 4 - max_components) {
          local_9c = first_component;
        }
        else {
          local_9c = 4 - max_components;
        }
        if ((info->NumOutputs != 0) || (bVar5 = true, max_outputs != 0)) {
          bVar5 = info->NumOutputs < max_outputs;
        }
        if (!bVar5) {
          __assert_fail("(info->NumOutputs == 0 && max_outputs == 0) || info->NumOutputs < max_outputs"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                        ,0x4fa,
                        "bool tfeedback_decl::store(struct gl_context *, struct gl_shader_program *, struct gl_transform_feedback_info *, unsigned int, unsigned int, const unsigned int, unsigned int **, bool *, bool, const void *) const"
                       );
        }
        bVar5 = is_varying_written(this);
        if (bVar5) {
          info->Outputs[info->NumOutputs].ComponentOffset = max_components;
          info->Outputs[info->NumOutputs].OutputRegister = num_components;
          info->Outputs[info->NumOutputs].NumComponents = local_9c;
          info->Outputs[info->NumOutputs].StreamId = this->stream_id;
          info->Outputs[info->NumOutputs].OutputBuffer = buffer;
          info->Outputs[info->NumOutputs].DstOffset = location;
          info->NumOutputs = info->NumOutputs + 1;
        }
        info->Buffers[buffer].Stream = this->stream_id;
        location = local_9c + location;
        num_components = num_components + 1;
        max_components = 0;
      }
      if ((explicit_stride == (bool *)0x0) || ((explicit_stride[buffer] & 1U) == 0)) {
        info->Buffers[buffer].Stride = location;
      }
      else {
        bVar5 = is_64bit(this);
        if ((bVar5) && ((info->Buffers[buffer].Stride & 1) != 0)) {
          linker_error(prog,
                       "invalid qualifier xfb_stride=%d must be a multiple of 8 as its applied to a type that is or contains a double."
                       ,(ulong)(info->Buffers[buffer].Stride << 2));
          return false;
        }
        if (info->Buffers[buffer].Stride < location) {
          linker_error(prog,"xfb_offset (%d) overflows xfb_stride (%d) for buffer (%d)",
                       (ulong)(location << 2),(ulong)(info->Buffers[buffer].Stride << 2),
                       (ulong)buffer);
          return false;
        }
      }
    }
    else {
      location_frac = 0;
    }
  }
  else {
    info->Buffers[buffer].Stride = this->skip_components + info->Buffers[buffer].Stride;
    location_frac = this->skip_components;
  }
  pcVar4 = ralloc_strdup(prog,this->orig_name);
  info->Varyings[info->NumVarying].Name = pcVar4;
  info->Varyings[info->NumVarying].Type = (GLenum16)this->type;
  info->Varyings[info->NumVarying].Size = location_frac;
  info->Varyings[info->NumVarying].BufferIndex = buffer_index;
  info->NumVarying = info->NumVarying + 1;
  info->Buffers[buffer].NumVaryings = info->Buffers[buffer].NumVaryings + 1;
  return true;
}

Assistant:

bool
tfeedback_decl::store(struct gl_context *ctx, struct gl_shader_program *prog,
                      struct gl_transform_feedback_info *info,
                      unsigned buffer, unsigned buffer_index,
                      const unsigned max_outputs,
                      BITSET_WORD *used_components[MAX_FEEDBACK_BUFFERS],
                      bool *explicit_stride, bool has_xfb_qualifiers,
                      const void* mem_ctx) const
{
   unsigned xfb_offset = 0;
   unsigned size = this->size;
   /* Handle gl_SkipComponents. */
   if (this->skip_components) {
      info->Buffers[buffer].Stride += this->skip_components;
      size = this->skip_components;
      goto store_varying;
   }

   if (this->next_buffer_separator) {
      size = 0;
      goto store_varying;
   }

   if (has_xfb_qualifiers) {
      xfb_offset = this->offset / 4;
   } else {
      xfb_offset = info->Buffers[buffer].Stride;
   }
   info->Varyings[info->NumVarying].Offset = xfb_offset * 4;

   {
      unsigned location = this->location;
      unsigned location_frac = this->location_frac;
      unsigned num_components = this->num_components();

      /* From GL_EXT_transform_feedback:
       *
       *   " A program will fail to link if:
       *
       *       * the total number of components to capture is greater than the
       *         constant MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS_EXT
       *         and the buffer mode is INTERLEAVED_ATTRIBS_EXT."
       *
       * From GL_ARB_enhanced_layouts:
       *
       *   " The resulting stride (implicit or explicit) must be less than or
       *     equal to the implementation-dependent constant
       *     gl_MaxTransformFeedbackInterleavedComponents."
       */
      if ((prog->TransformFeedback.BufferMode == GL_INTERLEAVED_ATTRIBS ||
           has_xfb_qualifiers) &&
          xfb_offset + num_components >
          ctx->Const.MaxTransformFeedbackInterleavedComponents) {
         linker_error(prog,
                      "The MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS "
                      "limit has been exceeded.");
         return false;
      }

      /* From the OpenGL 4.60.5 spec, section 4.4.2. Output Layout Qualifiers,
       * Page 76, (Transform Feedback Layout Qualifiers):
       *
       *   " No aliasing in output buffers is allowed: It is a compile-time or
       *     link-time error to specify variables with overlapping transform
       *     feedback offsets."
       */
      const unsigned max_components =
         ctx->Const.MaxTransformFeedbackInterleavedComponents;
      const unsigned first_component = xfb_offset;
      const unsigned last_component = xfb_offset + num_components - 1;
      const unsigned start_word = BITSET_BITWORD(first_component);
      const unsigned end_word = BITSET_BITWORD(last_component);
      BITSET_WORD *used;
      assert(last_component < max_components);

      if (!used_components[buffer]) {
         used_components[buffer] =
            rzalloc_array(mem_ctx, BITSET_WORD, BITSET_WORDS(max_components));
      }
      used = used_components[buffer];

      for (unsigned word = start_word; word <= end_word; word++) {
         unsigned start_range = 0;
         unsigned end_range = BITSET_WORDBITS - 1;

         if (word == start_word)
            start_range = first_component % BITSET_WORDBITS;

         if (word == end_word)
            end_range = last_component % BITSET_WORDBITS;

         if (used[word] & BITSET_RANGE(start_range, end_range)) {
            linker_error(prog,
                         "variable '%s', xfb_offset (%d) is causing aliasing.",
                         this->orig_name, xfb_offset * 4);
            return false;
         }
         used[word] |= BITSET_RANGE(start_range, end_range);
      }

      while (num_components > 0) {
         unsigned output_size = MIN2(num_components, 4 - location_frac);
         assert((info->NumOutputs == 0 && max_outputs == 0) ||
                info->NumOutputs < max_outputs);

         /* From the ARB_enhanced_layouts spec:
          *
          *    "If such a block member or variable is not written during a shader
          *    invocation, the buffer contents at the assigned offset will be
          *    undefined.  Even if there are no static writes to a variable or
          *    member that is assigned a transform feedback offset, the space is
          *    still allocated in the buffer and still affects the stride."
          */
         if (this->is_varying_written()) {
            info->Outputs[info->NumOutputs].ComponentOffset = location_frac;
            info->Outputs[info->NumOutputs].OutputRegister = location;
            info->Outputs[info->NumOutputs].NumComponents = output_size;
            info->Outputs[info->NumOutputs].StreamId = stream_id;
            info->Outputs[info->NumOutputs].OutputBuffer = buffer;
            info->Outputs[info->NumOutputs].DstOffset = xfb_offset;
            ++info->NumOutputs;
         }
         info->Buffers[buffer].Stream = this->stream_id;
         xfb_offset += output_size;

         num_components -= output_size;
         location++;
         location_frac = 0;
      }
   }

   if (explicit_stride && explicit_stride[buffer]) {
      if (this->is_64bit() && info->Buffers[buffer].Stride % 2) {
         linker_error(prog, "invalid qualifier xfb_stride=%d must be a "
                      "multiple of 8 as its applied to a type that is or "
                      "contains a double.",
                      info->Buffers[buffer].Stride * 4);
         return false;
      }

      if (xfb_offset > info->Buffers[buffer].Stride) {
         linker_error(prog, "xfb_offset (%d) overflows xfb_stride (%d) for "
                      "buffer (%d)", xfb_offset * 4,
                      info->Buffers[buffer].Stride * 4, buffer);
         return false;
      }
   } else {
      info->Buffers[buffer].Stride = xfb_offset;
   }

 store_varying:
   info->Varyings[info->NumVarying].Name = ralloc_strdup(prog,
                                                         this->orig_name);
   info->Varyings[info->NumVarying].Type = this->type;
   info->Varyings[info->NumVarying].Size = size;
   info->Varyings[info->NumVarying].BufferIndex = buffer_index;
   info->NumVarying++;
   info->Buffers[buffer].NumVaryings++;

   return true;
}